

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

void __thiscall
QMap<int,_QVariant>::QMap
          (QMap<int,_QVariant> *this,initializer_list<std::pair<int,_QVariant>_> list)

{
  const_iterator value;
  const_iterator key;
  long in_FS_OFFSET;
  pair<int,_QVariant> *p;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<std::pair<int,_QVariant>_> *__range2;
  initializer_list<std::pair<int,_QVariant>_> *in_stack_ffffffffffffff90;
  initializer_list<std::pair<int,_QVariant>_> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              *)0x8bc8e4);
  value = std::initializer_list<std::pair<int,_QVariant>_>::begin(&local_18);
  key = std::initializer_list<std::pair<int,_QVariant>_>::end(in_stack_ffffffffffffff90);
  for (; value != key; value = value + 1) {
    insert((QMap<int,_QVariant> *)value,&key->first,(QVariant *)value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMap(std::initializer_list<std::pair<Key, T>> list)
    {
        for (auto &p : list)
            insert(p.first, p.second);
    }